

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_casetab.cpp
# Opt level: O0

bool parse(char *line,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arr)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__s;
  size_type __n;
  bool local_52;
  allocator<char> local_51;
  value_type local_50;
  size_type local_30;
  size_t len;
  char *pend;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  int nf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arr_local;
  char *line_local;
  
  pend._4_4_ = 0;
  pvStack_18 = arr;
  arr_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)line;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(arr);
  while ((arr_local !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0 &&
         (len = (size_t)strchr((char *)arr_local,0x3b), __s = arr_local, this = pvStack_18,
         (char *)len != (char *)0x0))) {
    __n = len - (long)arr_local;
    local_30 = __n;
    if (__n == 0) {
      std::__cxx11::string::string((string *)&local_50);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_50,(char *)__s,__n,&local_51);
    }
    local_52 = __n != 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (local_52) {
      std::allocator<char>::~allocator(&local_51);
    }
    arr_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(len + 1);
    pend._4_4_ = pend._4_4_ + 1;
  }
  return pend._4_4_ == 0xe;
}

Assistant:

bool parse (const char* line, vector<string>& arr)
{
  int nf = 0;
  arr.clear ();
  while (line)
  {
    const char* pend = strchr (line, ';');
    if (!pend)
      break;
    size_t len = pend - line;
    arr.push_back (len ? string (line, len) : string ());
    line = pend + 1;
    ++nf;
  }
  return (nf == 14);
}